

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spell.cpp
# Opt level: O3

void Handlers::Spell_Target_Group(Character *character,PacketReader *reader)

{
  byte bVar1;
  int iVar2;
  World *pWVar3;
  bool bVar4;
  uint uVar5;
  mapped_type *this;
  ESF_Data *pEVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  key_type local_48;
  
  PacketReader::GetShort(reader);
  uVar5 = PacketReader::GetThree(reader);
  if ((character->spell_event == (TimeEvent *)0x0) && (character->spell_ready != true)) {
    return;
  }
  character->spell_target = TargetGroup;
  character->spell_target_id = 0;
  pWVar3 = character->world;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"EnforceTimestamps","");
  this = std::__detail::
         _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
         ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       *)&pWVar3->config,&local_48);
  bVar4 = util::variant::GetBool(this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  iVar8 = (int)uVar5 % 0x83d600;
  if (bVar4) {
    pEVar6 = ESF::Get(character->world->esf,(uint)character->spell_id);
    iVar2 = (character->timestamp).ts;
    if (iVar8 == -1) {
      bVar1 = pEVar6->cast_time;
      iVar7 = iVar2;
      if ((int)((uint)bVar1 * 0x2f + -0xc) <= iVar2) goto LAB_00165d83;
    }
    else {
      iVar7 = (iVar8 - iVar2) + 0x83d600;
      if (iVar2 <= iVar8) {
        iVar7 = iVar8 - iVar2;
      }
      iVar9 = iVar7;
      if (iVar2 == -1) {
        iVar9 = iVar8;
      }
      bVar1 = pEVar6->cast_time;
      if ((int)((uint)bVar1 * 0x2f + -0xc) <= iVar9) {
        if (iVar2 == -1) {
          iVar7 = iVar8;
        }
LAB_00165d83:
        if (iVar7 <= (int)(((uint)bVar1 + (uint)(bVar1 == 0)) * 0x32)) goto LAB_00165d9a;
      }
    }
    Character::CancelSpell(character);
  }
  else {
LAB_00165d9a:
    (character->timestamp).ts = iVar8;
    if (character->spell_ready == true) {
      Character::SpellAct(character);
    }
  }
  return;
}

Assistant:

void Spell_Target_Group(Character *character, PacketReader &reader)
{
	/*unsigned short spell_id = */reader.GetShort();
	Timestamp timestamp = reader.GetThree();

	if (!character->spell_event && !character->spell_ready)
		return;

	character->spell_target = Character::TargetGroup;
	character->spell_target_id = 0;

	if (character->world->config["EnforceTimestamps"])
	{
		const ESF_Data& spell = character->world->esf->Get(character->spell_id);

		if (timestamp - character->timestamp < (spell.cast_time - 1) * 47 + 35
		 || timestamp - character->timestamp > std::max<int>(spell.cast_time, 1) * 50)
		{
			character->CancelSpell();
			return;
		}
	}

	character->timestamp = timestamp;

	if (character->spell_ready)
		character->SpellAct();
}